

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_load.cpp
# Opt level: O2

void T_AddSpawnedThing(AActor *ac)

{
  DFraggleThinker *pDVar1;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 local_10;
  
  pDVar1 = GC::ReadBarrier<DFraggleThinker>((DFraggleThinker **)&DFraggleThinker::ActiveThinker);
  if (pDVar1 != (DFraggleThinker *)0x0) {
    pDVar1 = GC::ReadBarrier<DFraggleThinker>((DFraggleThinker **)&DFraggleThinker::ActiveThinker);
    local_10.p = (AActor *)0x0;
    if ((ac != (AActor *)0x0) && (((ac->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0)) {
      local_10.p = ac;
    }
    TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::Push
              (&pDVar1->SpawnedThings,(TObjPtr<AActor> *)&local_10);
  }
  return;
}

Assistant:

void T_AddSpawnedThing(AActor * ac)
{
	if (DFraggleThinker::ActiveThinker)
	{
		TArray<TObjPtr<AActor> > &SpawnedThings = DFraggleThinker::ActiveThinker->SpawnedThings;
		SpawnedThings.Push(GC::ReadBarrier(ac));
	}
}